

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O0

void __thiscall HighsSearch::addBoundExceedingConflict(HighsSearch *this)

{
  bool bVar1;
  pointer pHVar2;
  int *piVar3;
  double *pdVar4;
  size_type sVar5;
  HighsLpRelaxation *in_RDI;
  bool *this_00;
  HighsCutGeneration cutGen;
  double rhs;
  HighsCutGeneration *this_01;
  HighsCutPool *cutpool;
  HighsCutGeneration *in_stack_fffffffffffffec0;
  HighsConflictPool *in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  HighsInt in_stack_ffffffffffffff2c;
  double *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff38;
  HighsDomain *in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  HighsDomain *in_stack_ffffffffffffff50;
  HighsCutGeneration *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffffaf;
  double *in_stack_ffffffffffffffb0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  HighsDomain *in_stack_ffffffffffffffd0;
  HighsLpRelaxation *in_stack_ffffffffffffffd8;
  double local_10;
  
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x68fd7b);
  if ((pHVar2->upper_limit != INFINITY) || (NAN(pHVar2->upper_limit))) {
    pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x68fdb5);
    cutpool = (HighsCutPool *)&pHVar2->domain;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x68fdd8)
    ;
    bVar1 = HighsLpRelaxation::computeDualProof
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8
                       ,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
    if (bVar1) {
      pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x68fe30);
      bVar1 = HighsDomain::infeasible(&pHVar2->domain);
      if (!bVar1) {
        this_01 = (HighsCutGeneration *)&(in_RDI->lpsolver).solution_;
        this_00 = &(in_RDI->lpsolver).model_.lp_.is_scaled_;
        std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x68fe6c);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x68fe87);
        std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)this_00);
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x68fec0);
        HighsDomain::conflictAnalysis
                  (in_stack_ffffffffffffff40,(HighsInt *)in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x68ff05);
        HighsCutGeneration::HighsCutGeneration(in_stack_fffffffffffffec0,in_RDI,cutpool);
        pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x68ff32);
        piVar3 = std::vector<int,_std::allocator<int>_>::data
                           ((vector<int,_std::allocator<int>_> *)0x68ff47);
        pdVar4 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x68ff56);
        sVar5 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)this_00);
        HighsDebugSol::checkCut
                  ((HighsDebugSol *)&pHVar2->field_0x68b0,piVar3,pdVar4,(HighsInt)sVar5,local_10);
        HighsCutGeneration::generateConflict
                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
        HighsCutGeneration::~HighsCutGeneration(this_01);
      }
    }
  }
  return;
}

Assistant:

void HighsSearch::addBoundExceedingConflict() {
  if (mipsolver.mipdata_->upper_limit != kHighsInf) {
    double rhs;
    if (lp->computeDualProof(mipsolver.mipdata_->domain,
                             mipsolver.mipdata_->upper_limit, inds, vals,
                             rhs)) {
      if (mipsolver.mipdata_->domain.infeasible()) return;
      localdom.conflictAnalysis(inds.data(), vals.data(), inds.size(), rhs,
                                mipsolver.mipdata_->conflictPool);

      HighsCutGeneration cutGen(*lp, mipsolver.mipdata_->cutpool);
      mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                                 inds.size(), rhs);
      cutGen.generateConflict(localdom, inds, vals, rhs);
    }
  }
}